

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall Wasm::WasmBytecodeGenerator::PrintTypeStack(WasmBytecodeGenerator *this)

{
  WasmType type;
  EmitInfo *pEVar1;
  char16 *form;
  bool bVar2;
  int stepsBack;
  
  Output::Print(L"[");
  stepsBack = -2;
  do {
    pEVar1 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                       (&this->m_evalStack,stepsBack + 2);
    stepsBack = stepsBack + 1;
  } while (pEVar1->type != Limit);
  bVar2 = true;
  for (; -1 < stepsBack; stepsBack = stepsBack + -1) {
    pEVar1 = JsUtil::Stack<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_DefaultComparer>::Peek
                       (&this->m_evalStack,stepsBack);
    type = pEVar1->type;
    if (!bVar2) {
      Output::Print(L", ");
    }
    form = WasmTypes::GetTypeName(type);
    bVar2 = false;
    Output::Print(form);
  }
  Output::Print(L"]");
  return;
}

Assistant:

void WasmBytecodeGenerator::PrintTypeStack() const
{
    WriteTypeStack([](const char16* msg) { Output::Print(msg); });
}